

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_proto3.pb.cc
# Opt level: O0

void __thiscall proto3_unittest::TestAllTypes_NestedMessage::Clear(TestAllTypes_NestedMessage *this)

{
  uint32_t cached_has_bits;
  TestAllTypes_NestedMessage *this_local;
  
  (this->field_0)._impl_.bb_ = 0;
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestAllTypes_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:proto3_unittest.TestAllTypes.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.bb_ = 0;
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}